

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::declaration::declaration(declaration *this,wstring *id,expression_ptr *init)

{
  byte bVar1;
  bool local_21;
  expression_ptr *init_local;
  wstring *id_local;
  declaration *this_local;
  
  std::__cxx11::wstring::wstring((wstring *)this,(wstring *)id);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr
            (&this->init_,init);
  bVar1 = std::__cxx11::wstring::empty();
  local_21 = true;
  if ((bVar1 & 1) != 0) {
    local_21 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->init_);
  }
  if (local_21 != false) {
    return;
  }
  __assert_fail("!id.empty() || init_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                0x208,"mjs::declaration::declaration(const std::wstring &, expression_ptr &&)");
}

Assistant:

explicit declaration(const std::wstring& id, expression_ptr&& init) : id_(id), init_(std::move(init)) {
        assert(!id.empty() || init_);
    }